

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O3

target_ulong_conflict
helper_precrq_rs_ph_w_mips
          (target_ulong_conflict rs,target_ulong_conflict rt,CPUMIPSState_conflict *env)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  
  if ((int)rs < 0x7fff8000) {
    uVar3 = rs + 0x8000 & 0xffff0000;
  }
  else {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x40;
    uVar3 = 0x7fff0000;
  }
  if ((int)rt < 0x7fff8000) {
    uVar2 = rt + 0x8000 >> 0x10;
  }
  else {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x40;
    uVar2 = 0x7fff;
  }
  return uVar2 | uVar3;
}

Assistant:

target_ulong helper_precrq_rs_ph_w(target_ulong rs, target_ulong rt,
                                   CPUMIPSState *env)
{
    uint16_t tempB, tempA;

    tempB = mipsdsp_trunc16_sat16_round(rs, env);
    tempA = mipsdsp_trunc16_sat16_round(rt, env);

    return MIPSDSP_RETURN32_16(tempB, tempA);
}